

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int lzip_init(archive_read_filter *self)

{
  long lVar1;
  uint uVar2;
  uint u;
  int iVar3;
  void *pvVar4;
  long in_RDI;
  int ret;
  int log2dic;
  uint32_t dicsize;
  ssize_t avail_in;
  uchar props [5];
  lzma_filter filters [2];
  uchar *h;
  private_data_conflict1 *state;
  archive_read_filter *in_stack_ffffffffffffffa8;
  undefined1 local_4d;
  undefined1 auStack_4c [4];
  ssize_t *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  archive_read_filter *in_stack_ffffffffffffffc8;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  pvVar4 = __archive_read_filter_ahead
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  if (pvVar4 == (void *)0x0) {
    local_4 = -0x1e;
  }
  else {
    *(undefined1 *)(lVar1 + 0xa2) = *(undefined1 *)((long)pvVar4 + 4);
    local_4d = 0x5d;
    uVar2 = *(byte *)((long)pvVar4 + 5) & 0x1f;
    if ((uVar2 < 0xc) || (0x1b < uVar2)) {
      local_4 = -0x1e;
    }
    else {
      u = 1 << (sbyte)uVar2;
      if (0xc < uVar2) {
        u = u - (u >> 4) * ((int)(uint)*(byte *)((long)pvVar4 + 5) >> 5);
      }
      archive_le32enc(auStack_4c,u);
      __archive_read_filter_consume(in_stack_ffffffffffffffa8,CONCAT44(u,uVar2));
      *(undefined8 *)(lVar1 + 0xa8) = 6;
      iVar3 = lzma_properties_decode(&stack0xffffffffffffffb8,0,&local_4d,5);
      if (iVar3 == 0) {
        iVar3 = lzma_raw_decoder(lVar1,&stack0xffffffffffffffb8);
        if (iVar3 == 0) {
          local_4 = 0;
        }
        else {
          set_error((archive_read_filter *)CONCAT44(u,uVar2),iVar3);
          local_4 = -0x1e;
        }
      }
      else {
        set_error((archive_read_filter *)CONCAT44(u,uVar2),iVar3);
        local_4 = -0x1e;
      }
    }
  }
  return local_4;
}

Assistant:

static int
lzip_init(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *h;
	lzma_filter filters[2];
	unsigned char props[5];
	ssize_t avail_in;
	uint32_t dicsize;
	int log2dic, ret;

	state = (struct private_data *)self->data;
	h = __archive_read_filter_ahead(self->upstream, 6, &avail_in);
	if (h == NULL)
		return (ARCHIVE_FATAL);

	/* Get a version number. */
	state->lzip_ver = h[4];

	/*
	 * Setup lzma property.
	 */
	props[0] = 0x5d;

	/* Get dictionary size. */
	log2dic = h[5] & 0x1f;
	if (log2dic < 12 || log2dic > 27)
		return (ARCHIVE_FATAL);
	dicsize = 1U << log2dic;
	if (log2dic > 12)
		dicsize -= (dicsize / 16) * (h[5] >> 5);
	archive_le32enc(props+1, dicsize);

	/* Consume lzip header. */
	__archive_read_filter_consume(self->upstream, 6);
	state->member_in = 6;

	filters[0].id = LZMA_FILTER_LZMA1;
	filters[0].options = NULL;
	filters[1].id = LZMA_VLI_UNKNOWN;
	filters[1].options = NULL;

	ret = lzma_properties_decode(&filters[0], NULL, props, sizeof(props));
	if (ret != LZMA_OK) {
		set_error(self, ret);
		return (ARCHIVE_FATAL);
	}
	ret = lzma_raw_decoder(&(state->stream), filters);
#if LZMA_VERSION < 50010000
	free(filters[0].options);
#endif
	if (ret != LZMA_OK) {
		set_error(self, ret);
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}